

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall QMenuBar::mouseMoveEvent(QMenuBar *this,QMouseEvent *e)

{
  long lVar1;
  QMenuBarPrivate *this_00;
  long lVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  QAction *action;
  long extraout_RDX;
  long lVar8;
  bool popup;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double extraout_XMM0_Qa;
  undefined1 auVar12 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar13 [16];
  
  this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((byte)e[0x44] & 1) == 0) {
    this_00->field_0x298 = this_00->field_0x298 & 0xfe;
    iVar5 = QMouseEvent::source();
    if (iVar5 != 0) {
      return;
    }
  }
  popup = true;
  if ((this_00->field_0x2a0 & 1) == 0) {
    popup = (bool)(this_00->field_0x298 & 1);
  }
  uVar6 = QEventPoint::position();
  auVar13._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar13._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar13 = minpd(_DAT_0066f5d0,auVar13);
  auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar13._8_8_);
  auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar13._0_8_);
  uVar7 = movmskpd(uVar6,auVar12);
  uVar10 = 0x8000000000000000;
  if ((uVar7 & 1) != 0) {
    uVar10 = (ulong)(uint)(int)auVar13._0_8_ << 0x20;
  }
  uVar9 = 0x80000000;
  if ((uVar7 & 2) != 0) {
    uVar9 = (ulong)(uint)(int)auVar13._8_8_;
  }
  action = QMenuBarPrivate::actionAt(this_00,(QPoint)(uVar9 | uVar10));
  bVar3 = popup;
  if (action == (QAction *)0x0) goto joined_r0x0046f02c;
  lVar2 = (this_00->hiddenActions).d.size;
  if (lVar2 == 0) {
LAB_0046f011:
    lVar8 = -1;
  }
  else {
    lVar8 = extraout_RDX;
    lVar11 = -8;
    do {
      lVar1 = lVar2 * -8 + lVar11;
      if (lVar1 == -8) goto LAB_0046f00b;
      lVar8 = lVar11 + 8;
      lVar4 = lVar11 + 8;
      lVar11 = lVar8;
    } while (*(QAction **)((long)(this_00->hiddenActions).d.ptr + lVar4) != action);
    lVar8 = lVar8 >> 3;
LAB_0046f00b:
    if (lVar1 == -8) goto LAB_0046f011;
  }
  bVar3 = (bool)(lVar8 != -1 & popup);
joined_r0x0046f02c:
  if (bVar3 != false) {
    return;
  }
  QMenuBarPrivate::setCurrentAction(this_00,action,popup,false);
  return;
}

Assistant:

void QMenuBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (!(e->buttons() & Qt::LeftButton)) {
        d->mouseDown = false;
        // We receive mouse move and mouse press on touch.
        // Mouse move will open the menu and mouse press
        // will close it, so ignore mouse move.
        if (e->source() != Qt::MouseEventNotSynthesized)
            return;
    }

    bool popupState = d->popupState || d->mouseDown;
    QAction *action = d->actionAt(e->position().toPoint());
    if ((action && d->isVisible(action)) || !popupState)
        d->setCurrentAction(action, popupState);
}